

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O0

boolean l2_absorb_expr_lshift_rshift_rshift_unsigned1(void)

{
  boolean bVar1;
  undefined1 local_9;
  
  bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_LSHIFT);
  if (bVar1 == '\0') {
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT);
    if (bVar1 == '\0') {
      bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT_UNSIGNED);
      if (bVar1 == '\0') {
        local_9 = '\x01';
      }
      else {
        l2_parse_token_forward();
        bVar1 = l2_absorb_expr_plus_sub();
        if (bVar1 == '\0') {
          local_9 = '\0';
        }
        else {
          local_9 = l2_absorb_expr_lshift_rshift_rshift_unsigned1();
        }
      }
    }
    else {
      l2_parse_token_forward();
      bVar1 = l2_absorb_expr_plus_sub();
      if (bVar1 == '\0') {
        local_9 = '\0';
      }
      else {
        local_9 = l2_absorb_expr_lshift_rshift_rshift_unsigned1();
      }
    }
  }
  else {
    l2_parse_token_forward();
    bVar1 = l2_absorb_expr_plus_sub();
    if (bVar1 == '\0') {
      local_9 = '\0';
    }
    else {
      local_9 = l2_absorb_expr_lshift_rshift_rshift_unsigned1();
    }
  }
  return local_9;
}

Assistant:

boolean l2_absorb_expr_lshift_rshift_rshift_unsigned1() {
    _if_type (L2_TOKEN_LSHIFT)
    {
        return l2_absorb_expr_plus_sub() ? l2_absorb_expr_lshift_rshift_rshift_unsigned1() : L2_FALSE;
    }
    _elif_type (L2_TOKEN_RSHIFT)
    {
        return l2_absorb_expr_plus_sub() ? l2_absorb_expr_lshift_rshift_rshift_unsigned1() : L2_FALSE;
    }
    _elif_type (L2_TOKEN_RSHIFT_UNSIGNED)
    {
        return l2_absorb_expr_plus_sub() ? l2_absorb_expr_lshift_rshift_rshift_unsigned1() : L2_FALSE;
    }
    _end

    return L2_TRUE;
}